

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::SplitProgramPath(string *in_name,string *dir,string *file,bool param_4)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  string oldDir;
  
  std::__cxx11::string::_M_assign((string *)dir);
  file->_M_string_length = 0;
  *(file->_M_dataplus)._M_p = '\0';
  ConvertToUnixSlashes(dir);
  bVar1 = FileIsDirectory(dir);
  if (!bVar1) {
    lVar3 = std::__cxx11::string::rfind((char)dir,0x2f);
    if (lVar3 == -1) {
      std::__cxx11::string::_M_assign((string *)file);
      dir->_M_string_length = 0;
      *(dir->_M_dataplus)._M_p = '\0';
    }
    else {
      std::__cxx11::string::substr((ulong)&oldDir,(ulong)dir);
      std::__cxx11::string::operator=((string *)file,(string *)&oldDir);
      std::__cxx11::string::~string((string *)&oldDir);
      std::__cxx11::string::resize((ulong)dir);
    }
  }
  bVar1 = true;
  if (dir->_M_string_length != 0) {
    bVar2 = FileIsDirectory(dir);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&oldDir,(string *)in_name);
      ConvertToUnixSlashes(&oldDir);
      std::__cxx11::string::_M_assign((string *)dir);
      std::__cxx11::string::~string((string *)&oldDir);
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool SystemTools::SplitProgramPath(const std::string& in_name,
                                   std::string& dir, std::string& file, bool)
{
  dir = in_name;
  file.clear();
  SystemTools::ConvertToUnixSlashes(dir);

  if (!SystemTools::FileIsDirectory(dir)) {
    std::string::size_type slashPos = dir.rfind('/');
    if (slashPos != std::string::npos) {
      file = dir.substr(slashPos + 1);
      dir.resize(slashPos);
    } else {
      file = dir;
      dir.clear();
    }
  }
  if (!(dir.empty()) && !SystemTools::FileIsDirectory(dir)) {
    std::string oldDir = in_name;
    SystemTools::ConvertToUnixSlashes(oldDir);
    dir = in_name;
    return false;
  }
  return true;
}